

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void setupFlattenImportedUnits(ImporterPtr *importer,ModelPtr *model,string *variation)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  allocator<char> local_441;
  string local_440 [39];
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [39];
  allocator<char> local_3c9;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  UnitsPtr u;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [32];
  undefined1 local_348 [8];
  UnitsPtr iu4;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  undefined1 local_2e8 [8];
  UnitsPtr iu3;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  ImportSourcePtr importIntermediary2;
  string local_298 [32];
  undefined1 local_278 [8];
  ImportSourcePtr importIntermediary1;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  undefined1 local_218 [8];
  UnitsPtr iu2;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  UnitsPtr iu1;
  string local_1a0 [32];
  string local_180 [23];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  shared_ptr<libcellml::Importer> local_f8;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  ModelPtr intermediaryImportModel2;
  string local_a8 [32];
  undefined1 local_88 [8];
  ModelPtr intermediaryImportModel1;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ImportSourcePtr import;
  ModelPtr unitsDefinitionsModel;
  string *variation_local;
  ModelPtr *model_local;
  ImporterPtr *importer_local;
  
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"importer/units/units_definitions.cellml",&local_61);
  createBaseModelImport
            ((ModelPtr *)local_40,
             (string *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"import_model1",
             (allocator<char> *)
             ((long)&intermediaryImportModel2.
                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Model::create((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&intermediaryImportModel2.
                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"import_model2",&local_e1);
  libcellml::Model::create((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  libcellml::Importer::create(SUB81(&local_f8,0));
  std::shared_ptr<libcellml::Importer>::operator=(importer,&local_f8);
  std::shared_ptr<libcellml::Importer>::~shared_ptr(&local_f8);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"units_definitions",&local_119);
  libcellml::Importer::addModel
            ((shared_ptr *)peVar2,
             (string *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"int1",&local_141);
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)local_88);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"int2",&local_169);
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)local_c0);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"main_model",
             (allocator<char> *)
             ((long)&iu1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create(local_180);
  std::shared_ptr<libcellml::Model>::operator=(model,(shared_ptr<libcellml::Model> *)local_180);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iu1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"per_fmol",&local_1d9);
  libcellml::Units::create((string *)local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1b8);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"per_fmol",
             (allocator<char> *)
             ((long)&iu2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iu2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"fmol",&local_239);
  libcellml::Units::create((string *)local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_218);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"fmol",
             (allocator<char> *)
             ((long)&importIntermediary1.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importIntermediary1.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c0);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"I_am_a_url",
             (allocator<char> *)
             ((long)&importIntermediary2.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importIntermediary2.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_278);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"I_am_a_url",
             (allocator<char> *)
             ((long)&iu3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iu3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2b0);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_308,"per_fmol",&local_309);
  libcellml::Units::create((string *)local_2e8);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2e8);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"per_fmol",
             (allocator<char> *)
             ((long)&iu4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iu4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"fmol",&local_369);
  libcellml::Units::create((string *)local_348);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_348);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"fmol",
             (allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3c8,"fmol",&local_3c9);
    libcellml::Units::create((string *)local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3f0,"mole",&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_418,"femto",&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_440,"",&local_441);
    libcellml::Units::addUnit((string *)peVar3,local_3f0,1.0,1.0,local_418);
    std::__cxx11::string::~string(local_440);
    std::allocator<char>::~allocator(&local_441);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator(&local_419);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    bVar1 = std::operator==(variation,"int1");
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
      libcellml::Model::addUnits((shared_ptr *)peVar4);
    }
    else {
      bVar1 = std::operator==(variation,"main");
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        libcellml::Model::addUnits((shared_ptr *)peVar4);
      }
    }
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_3a8);
  }
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)model);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)model);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_348);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_2e8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_2b0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_278);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_218);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_1b8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_88);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_40);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void setupFlattenImportedUnits(libcellml::ImporterPtr &importer, libcellml::ModelPtr &model, const std::string &variation)
{
    libcellml::ModelPtr unitsDefinitionsModel;
    libcellml::ImportSourcePtr import = createBaseModelImport(unitsDefinitionsModel, "importer/units/units_definitions.cellml");

    libcellml::ModelPtr intermediaryImportModel1 = libcellml::Model::create("import_model1");
    libcellml::ModelPtr intermediaryImportModel2 = libcellml::Model::create("import_model2");

    importer = libcellml::Importer::create();

    importer->addModel(unitsDefinitionsModel, "units_definitions");
    importer->addModel(intermediaryImportModel1, "int1");
    importer->addModel(intermediaryImportModel2, "int2");

    model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr iu1 = libcellml::Units::create("per_fmol");
    iu1->setImportSource(import);
    iu1->setImportReference("per_fmol");

    libcellml::UnitsPtr iu2 = libcellml::Units::create("fmol");
    iu2->setImportSource(import);
    iu2->setImportReference("fmol");

    intermediaryImportModel1->addUnits(iu1);
    intermediaryImportModel2->addUnits(iu2);

    libcellml::ImportSourcePtr importIntermediary1 = libcellml::ImportSource::create();
    importIntermediary1->setUrl("I_am_a_url");
    importIntermediary1->setModel(intermediaryImportModel1);

    libcellml::ImportSourcePtr importIntermediary2 = libcellml::ImportSource::create();
    importIntermediary2->setUrl("I_am_a_url");
    importIntermediary2->setModel(intermediaryImportModel2);

    libcellml::UnitsPtr iu3 = libcellml::Units::create("per_fmol");
    iu3->setImportSource(importIntermediary1);
    iu3->setImportReference("per_fmol");

    libcellml::UnitsPtr iu4 = libcellml::Units::create("fmol");
    iu4->setImportSource(importIntermediary2);
    iu4->setImportReference("fmol");

    if (!variation.empty()) {
        libcellml::UnitsPtr u = libcellml::Units::create("fmol");
        u->addUnit("mole", "femto");
        if (variation == "int1") {
            intermediaryImportModel1->addUnits(u);
        } else if (variation == "main") {
            model->addUnits(u);
        }
    }

    model->addUnits(iu3);
    model->addUnits(iu4);
}